

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

bool google::protobuf::compiler::CodeGeneratorRequest::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = protobuf::internal::AllAreInitialized<google::protobuf::FileDescriptorProto>
                    ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)(msg + 3));
  if (bVar1) {
    bVar1 = protobuf::internal::AllAreInitialized<google::protobuf::FileDescriptorProto>
                      ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
                       &msg[4]._internal_metadata_);
    return bVar1;
  }
  return false;
}

Assistant:

PROTOBUF_NOINLINE bool CodeGeneratorRequest::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const CodeGeneratorRequest&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_proto_file()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_source_file_descriptors()))
    return false;
  return true;
}